

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Semaphore.h
# Opt level: O2

__sighandler_t __thiscall
axl::sys::NamedSemaphore::signal(NamedSemaphore *this,int __sig,__sighandler_t __handler)

{
  bool bVar1;
  undefined7 in_register_00000001;
  undefined7 extraout_var;
  long lVar2;
  undefined4 in_register_00000034;
  
  lVar2 = CONCAT44(in_register_00000034,__sig) + 1;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) break;
    bVar1 = psx::NamedSem::post(&this->m_sem);
    in_register_00000001 = extraout_var;
  } while (bVar1);
  return (__sighandler_t)CONCAT71(in_register_00000001,lVar2 == 0);
}

Assistant:

bool
	signal(size_t count) {
		for (; count; count--) {
			bool result = m_sem.post();
			if (!result)
				return false;
		}

		return true;
	}